

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

void Js::JavascriptOperators::PatchInitValue<false,Js::InlineCache>
               (FunctionBody *functionBody,InlineCache *inlineCache,
               InlineCacheIndex inlineCacheIndex,RecyclableObject *object,PropertyId propertyId,
               Var newValue)

{
  Type *typeWithoutProperty;
  undefined8 object_00;
  bool bVar1;
  int iVar2;
  ScriptContext *requestContext;
  bool bVar3;
  undefined1 local_a0 [8];
  PropertyValueInfo info;
  
  info._56_8_ = object;
  requestContext = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
  bVar3 = newValue == (Var)0x0;
  local_a0 = (undefined1  [8])0x0;
  info.m_instance = (RecyclableObject *)0x50000ffff;
  info.m_propertyIndex = 0;
  info.m_attributes = '\0';
  info.flags = InlineCacheNoFlags;
  info.cacheInfoFlag = 0;
  info.inlineCache = (InlineCache *)0x0;
  info.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
  info.functionBody = (FunctionBody *)0x0;
  info.prop = (RecyclableObject *)0x0;
  info.propertyRecordUsageCache._0_4_ = 0xffffffff;
  info.propertyRecordUsageCache._5_1_ = 1;
  PropertyValueInfo::SetCacheInfo
            ((PropertyValueInfo *)local_a0,functionBody,inlineCache,inlineCacheIndex,true);
  object_00 = info._56_8_;
  bVar1 = CacheOperators::TrySetProperty<true,true,false,true,true,true,false,false>
                    ((RecyclableObject *)info._56_8_,false,propertyId,newValue,requestContext,
                     (uint)bVar3 << 4,(PropertyCacheOperationInfo *)0x0,
                     (PropertyValueInfo *)local_a0);
  if (bVar1) {
    return;
  }
  bVar1 = Phases::IsEnabled((Phases *)&DAT_015cd718,InlineCachePhase);
  if ((bVar1) && (DAT_015d346a == '\x01')) {
    CacheOperators::TraceCache
              (inlineCache,L"PatchInitValue",propertyId,requestContext,(RecyclableObject *)object_00
              );
  }
  typeWithoutProperty = *(Type **)(object_00 + 8);
  if (((((functionBody->super_ParseableFunctionInfo).super_FunctionProxy.field_0x47 & 1) == 0) ||
      (iVar2 = (**(code **)(*(long *)object_00 + 0xd8))
                         (object_00,propertyId,newValue,(ulong)bVar3 << 4,local_a0), iVar2 == 0)) &&
     (iVar2 = (**(code **)(*(long *)object_00 + 0xd0))
                        (object_00,propertyId,newValue,(ulong)bVar3 << 4,local_a0), iVar2 == 0)) {
    return;
  }
  CacheOperators::CachePropertyWrite
            ((RecyclableObject *)object_00,false,typeWithoutProperty,propertyId,
             (PropertyValueInfo *)local_a0,requestContext);
  return;
}

Assistant:

inline void JavascriptOperators::PatchInitValue(FunctionBody *const functionBody, TInlineCache *const inlineCache, const InlineCacheIndex inlineCacheIndex, RecyclableObject* object, PropertyId propertyId, Var newValue)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_PatchInitValue);
        ScriptContext *const scriptContext = functionBody->GetScriptContext();

        const PropertyOperationFlags flags = newValue == NULL ? PropertyOperation_SpecialValue : PropertyOperation_None;
        PropertyValueInfo info;
        PropertyValueInfo::SetCacheInfo(&info, functionBody, inlineCache, inlineCacheIndex, !IsFromFullJit);
        if (CacheOperators::TrySetProperty<true, true, false, true, true, !TInlineCache::IsPolymorphic, TInlineCache::IsPolymorphic, false>(
                object, false, propertyId, newValue, scriptContext, flags, nullptr, &info))
        {
            return;
        }

#if DBG_DUMP
        if (PHASE_VERBOSE_TRACE1(Js::InlineCachePhase))
        {
            CacheOperators::TraceCache(inlineCache, _u("PatchInitValue"), propertyId, scriptContext, object);
        }
#endif

        Type *typeWithoutProperty = object->GetType();

        if (functionBody->IsEval())
        {
            if (object->InitPropertyInEval(propertyId, newValue, flags, &info))
            {
                CacheOperators::CachePropertyWrite(object, false, typeWithoutProperty, propertyId, &info, scriptContext);
                return;
            }
        }

        // Ideally the lowerer would emit a call to the right flavor of PatchInitValue, so that we can ensure that we only
        // ever initialize to NULL in the right cases.  But the backend uses the StFld opcode for initialization, and it
        // would be cumbersome to thread the different helper calls all the way down
        if (object->InitProperty(propertyId, newValue, flags, &info))
        {
            CacheOperators::CachePropertyWrite(object, false, typeWithoutProperty, propertyId, &info, scriptContext);
        }
        JIT_HELPER_END(Op_PatchInitValue);
    }